

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O0

char * __thiscall
cmCommandArgumentParserHelper::ExpandVariable(cmCommandArgumentParserHelper *this,char *var)

{
  cmMakefile *pcVar1;
  Snapshot snapshot;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  ostream *poVar7;
  cmake *this_00;
  char *local_690;
  bool local_5eb;
  byte local_5c9;
  allocator local_589;
  string local_588;
  allocator local_561;
  string local_560;
  string local_540;
  string local_520;
  allocator local_4f9;
  string local_4f8;
  string local_4d8;
  Snapshot local_4b8;
  undefined1 local_4a0 [8];
  cmOutputConverter converter;
  cmListFileContext lfc;
  ostringstream msg;
  allocator local_2b9;
  string local_2b8;
  byte local_293;
  byte local_292;
  allocator local_291;
  string local_290;
  byte local_26b;
  byte local_26a;
  allocator local_269;
  string local_268;
  byte local_243;
  byte local_242;
  allocator local_241;
  string local_240;
  byte local_21b;
  byte local_21a;
  allocator local_219;
  string local_218;
  allocator local_1f1;
  string local_1f0;
  char *local_1d0;
  char *value;
  ostringstream local_198 [8];
  ostringstream ostr;
  char *var_local;
  cmCommandArgumentParserHelper *this_local;
  
  if (var == (char *)0x0) {
    this_local = (cmCommandArgumentParserHelper *)0x0;
  }
  else if ((this->FileLine < 0) || (iVar5 = strcmp(var,"CMAKE_CURRENT_LIST_LINE"), iVar5 != 0)) {
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1f0,var,&local_1f1);
    local_690 = cmMakefile::GetDefinition(pcVar1,&local_1f0);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
    local_1d0 = local_690;
    if ((local_690 == (char *)0x0) && ((this->RemoveEmpty & 1U) == 0)) {
      local_21a = 0;
      local_21b = 0;
      local_5c9 = 0;
      if ((this->WarnUninitialized & 1U) != 0) {
        pcVar1 = this->Makefile;
        std::allocator<char>::allocator();
        local_21a = 1;
        std::__cxx11::string::string((string *)&local_218,var,&local_219);
        local_21b = 1;
        bVar3 = cmMakefile::VariableInitialized(pcVar1,&local_218);
        local_5c9 = bVar3 ^ 0xff;
      }
      if ((local_21b & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_218);
      }
      if ((local_21a & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_219);
      }
      if ((local_5c9 & 1) != 0) {
        local_242 = 0;
        local_243 = 0;
        local_26a = 0;
        local_26b = 0;
        local_292 = 0;
        local_293 = 0;
        bVar2 = false;
        bVar3 = false;
        local_5eb = true;
        if ((this->CheckSystemVars & 1U) == 0) {
          pcVar6 = this->FileName;
          std::allocator<char>::allocator();
          local_242 = 1;
          std::__cxx11::string::string((string *)&local_240,pcVar6,&local_241);
          local_243 = 1;
          pcVar6 = cmMakefile::GetHomeDirectory(this->Makefile);
          std::allocator<char>::allocator();
          local_26a = 1;
          std::__cxx11::string::string((string *)&local_268,pcVar6,&local_269);
          local_26b = 1;
          bVar4 = cmsys::SystemTools::IsSubDirectory(&local_240,&local_268);
          local_5eb = true;
          if (!bVar4) {
            pcVar6 = this->FileName;
            std::allocator<char>::allocator();
            local_292 = 1;
            std::__cxx11::string::string((string *)&local_290,pcVar6,&local_291);
            local_293 = 1;
            pcVar6 = cmMakefile::GetHomeOutputDirectory(this->Makefile);
            std::allocator<char>::allocator();
            bVar2 = true;
            std::__cxx11::string::string((string *)&local_2b8,pcVar6,&local_2b9);
            bVar3 = true;
            local_5eb = cmsys::SystemTools::IsSubDirectory(&local_290,&local_2b8);
          }
        }
        if (bVar3) {
          std::__cxx11::string::~string((string *)&local_2b8);
        }
        if (bVar2) {
          std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
        }
        if ((local_293 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_290);
        }
        if ((local_292 & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)&local_291);
        }
        if ((local_26b & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_268);
        }
        if ((local_26a & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)&local_269);
        }
        if ((local_243 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_240);
        }
        if ((local_242 & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)&local_241);
        }
        if (local_5eb != false) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&lfc.Line);
          cmListFileContext::cmListFileContext((cmListFileContext *)&converter.LinkScriptShell);
          cmMakefile::GetStateSnapshot(&local_4b8,this->Makefile);
          snapshot.Position.Tree = local_4b8.Position.Tree;
          snapshot.State = local_4b8.State;
          snapshot.Position.Position = local_4b8.Position.Position;
          cmOutputConverter::cmOutputConverter((cmOutputConverter *)local_4a0,snapshot);
          pcVar6 = this->FileName;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_4f8,pcVar6,&local_4f9);
          cmOutputConverter::Convert
                    (&local_4d8,(cmOutputConverter *)local_4a0,&local_4f8,HOME,UNCHANGED);
          std::__cxx11::string::operator=
                    ((string *)(lfc.Name.field_2._M_local_buf + 8),(string *)&local_4d8);
          std::__cxx11::string::~string((string *)&local_4d8);
          std::__cxx11::string::~string((string *)&local_4f8);
          std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
          lfc.FilePath.field_2._8_8_ = this->FileLine;
          poVar7 = std::operator<<((ostream *)&lfc.Line,"uninitialized variable \'");
          poVar7 = std::operator<<(poVar7,var);
          std::operator<<(poVar7,"\'");
          this_00 = cmMakefile::GetCMakeInstance(this->Makefile);
          std::__cxx11::ostringstream::str();
          cmake::IssueMessage(this_00,AUTHOR_WARNING,&local_520,
                              (cmListFileContext *)&converter.LinkScriptShell);
          std::__cxx11::string::~string((string *)&local_520);
          cmListFileContext::~cmListFileContext((cmListFileContext *)&converter.LinkScriptShell);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&lfc.Line);
        }
      }
      this_local = (cmCommandArgumentParserHelper *)0x0;
    }
    else if (((this->EscapeQuotes & 1U) == 0) || (local_690 == (char *)0x0)) {
      if (local_690 == (char *)0x0) {
        local_690 = "";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_588,local_690,&local_589);
      this_local = (cmCommandArgumentParserHelper *)AddString(this,&local_588);
      std::__cxx11::string::~string((string *)&local_588);
      std::allocator<char>::~allocator((allocator<char> *)&local_589);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_560,local_690,&local_561);
      cmSystemTools::EscapeQuotes(&local_540,&local_560);
      this_local = (cmCommandArgumentParserHelper *)AddString(this,&local_540);
      std::__cxx11::string::~string((string *)&local_540);
      std::__cxx11::string::~string((string *)&local_560);
      std::allocator<char>::~allocator((allocator<char> *)&local_561);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_198);
    std::ostream::operator<<(local_198,this->FileLine);
    std::__cxx11::ostringstream::str();
    this_local = (cmCommandArgumentParserHelper *)AddString(this,(string *)&value);
    std::__cxx11::string::~string((string *)&value);
    std::__cxx11::ostringstream::~ostringstream(local_198);
  }
  return this_local->EmptyVariable;
}

Assistant:

char* cmCommandArgumentParserHelper::ExpandVariable(const char* var)
{
  if(!var)
    {
    return 0;
    }
  if(this->FileLine >= 0 && strcmp(var, "CMAKE_CURRENT_LIST_LINE") == 0)
    {
    std::ostringstream ostr;
    ostr << this->FileLine;
    return this->AddString(ostr.str());
    }
  const char* value = this->Makefile->GetDefinition(var);
  if(!value && !this->RemoveEmpty)
    {
    // check to see if we need to print a warning
    // if strict mode is on and the variable has
    // not been "cleared"/initialized with a set(foo ) call
    if(this->WarnUninitialized && !this->Makefile->VariableInitialized(var))
      {
      if (this->CheckSystemVars ||
          cmSystemTools::IsSubDirectory(this->FileName,
                                        this->Makefile->GetHomeDirectory()) ||
          cmSystemTools::IsSubDirectory(this->FileName,
                                     this->Makefile->GetHomeOutputDirectory()))
        {
        std::ostringstream msg;
        cmListFileContext lfc;
        cmOutputConverter converter(this->Makefile->GetStateSnapshot());
        lfc.FilePath = converter.Convert(this->FileName,
                                         cmOutputConverter::HOME);

        lfc.Line = this->FileLine;
        msg << "uninitialized variable \'" << var << "\'";
        this->Makefile->GetCMakeInstance()->IssueMessage(cmake::AUTHOR_WARNING,
                                                        msg.str(), lfc);
        }
      }
    return 0;
    }
  if (this->EscapeQuotes && value)
    {
    return this->AddString(cmSystemTools::EscapeQuotes(value));
    }
  return this->AddString(value ? value : "");
}